

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PrimitiveInstanceSymbol::serializeTo
          (PrimitiveInstanceSymbol *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  size_t sVar1;
  long lVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar3;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar4;
  string_view name;
  string_view name_00;
  
  name._M_str = "primitiveType";
  name._M_len = 0xd;
  ASTSerializer::writeLink(serializer,name,&this->primitiveType->super_Symbol);
  name_00._M_str = "ports";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  sVar3 = getPortConnections(this);
  if (sVar3._M_extent._M_extent_value._M_extent_value != 0) {
    lVar2 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)sVar3._M_ptr + lVar2));
      lVar2 = lVar2 + 8;
    } while (sVar3._M_extent._M_extent_value._M_extent_value << 3 != lVar2);
  }
  ASTSerializer::endArray(serializer);
  __n = getDelay(this);
  if (__n != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)__n);
  }
  pVar4 = getDriveStrength(this);
  if (((ulong)pVar4.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DriveStrength>.
              super__Optional_base<slang::ast::DriveStrength,_true,_true> >> 0x20 & 1) != 0) {
    sVar1 = strlen(*(char **)(toString(slang::ast::DriveStrength)::strings +
                             (long)(int)pVar4.first.
                                        super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                                        _M_payload.
                                        super__Optional_payload_base<slang::ast::DriveStrength>.
                                        _M_payload * 8));
    ASTSerializer::write(serializer,0xe,"driveStrength0",sVar1);
  }
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    return;
  }
  sVar1 = strlen(*(char **)(toString(slang::ast::DriveStrength)::strings +
                           (long)(int)pVar4.second.
                                      super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<slang::ast::DriveStrength>.
                                      _M_payload * 8));
  ASTSerializer::write(serializer,0xe,"driveStrength1",sVar1);
  return;
}

Assistant:

void PrimitiveInstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("primitiveType", primitiveType);

    serializer.startArray("ports");
    for (auto expr : getPortConnections())
        serializer.serialize(*expr);
    serializer.endArray();

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}